

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O2

void FAudio_OPERATIONSET_QueueSetOutputMatrix
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,uint32_t SourceChannels,
               uint32_t DestinationChannels,float *pLevelMatrix,uint32_t OperationSet)

{
  FAudio_OPERATIONSET_Operation *pFVar1;
  float *pfVar2;
  size_t sVar3;
  
  FAudio_PlatformLockMutex(voice->audio->operationLock);
  pFVar1 = QueueOperation(voice,FAUDIOOP_SETOUTPUTMATRIX,OperationSet);
  (pFVar1->Data).SetOutputFilterParameters.pDestinationVoice = pDestinationVoice;
  (pFVar1->Data).SetOutputMatrix.SourceChannels = SourceChannels;
  (pFVar1->Data).SetOutputMatrix.DestinationChannels = DestinationChannels;
  sVar3 = (ulong)DestinationChannels * (ulong)SourceChannels * 4;
  pfVar2 = (float *)(*voice->audio->pMalloc)(sVar3);
  (pFVar1->Data).SetOutputMatrix.pLevelMatrix = pfVar2;
  SDL_memcpy(pfVar2,pLevelMatrix,sVar3);
  FAudio_PlatformUnlockMutex(voice->audio->operationLock);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueSetOutputMatrix(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	uint32_t SourceChannels,
	uint32_t DestinationChannels,
	const float *pLevelMatrix,
	uint32_t OperationSet
) {
	FAudio_OPERATIONSET_Operation *op;

	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	op = QueueOperation(
		voice,
		FAUDIOOP_SETOUTPUTMATRIX,
		OperationSet
	);

	op->Data.SetOutputMatrix.pDestinationVoice = pDestinationVoice;
	op->Data.SetOutputMatrix.SourceChannels = SourceChannels;
	op->Data.SetOutputMatrix.DestinationChannels = DestinationChannels;
	op->Data.SetOutputMatrix.pLevelMatrix = voice->audio->pMalloc(
		sizeof(float) * SourceChannels * DestinationChannels
	);
	FAudio_memcpy(
		op->Data.SetOutputMatrix.pLevelMatrix,
		pLevelMatrix,
		sizeof(float) * SourceChannels * DestinationChannels
	);

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}